

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromisehelpers.h
# Opt level: O0

Type __thiscall QtPromise::resolve<QList<QString>>(QtPromise *this,QList<QString> *value)

{
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QString>_>_> extraout_RDX;
  Type TVar1;
  anon_class_8_1_a8c68091 local_20;
  QList<QString> *local_18;
  QList<QString> *value_local;
  
  local_20.value = value;
  local_18 = value;
  value_local = (QList<QString> *)this;
  QPromise<QList<QString>>::
  QPromise<QtPromise::resolve<QList<QString>>(QList<QString>&&)::_lambda(QtPromise::QPromiseResolve<QList<QString>>&&,QtPromise::QPromiseReject<QList<QString>>&&)_1_>
            ((QPromise<QList<QString>> *)this,&local_20);
  TVar1.super_QPromiseBase<QList<QString>_>.m_d.d = extraout_RDX.d;
  TVar1.super_QPromiseBase<QList<QString>_>._vptr_QPromiseBase = (_func_int **)this;
  return (Type)TVar1.super_QPromiseBase<QList<QString>_>;
}

Assistant:

static inline typename QtPromisePrivate::PromiseDeduce<T>::Type resolve(T&& value)
{
    using namespace QtPromisePrivate;
    using PromiseType = typename PromiseDeduce<T>::Type;
    using ValueType = typename PromiseType::Type;
    using ResolveType = QPromiseResolve<ValueType>;
    using RejectType = QPromiseReject<ValueType>;

    return PromiseType{[&](ResolveType&& resolve, RejectType&& reject) {
        PromiseFulfill<Unqualified<T>>::call(std::forward<T>(value),
                                             std::forward<ResolveType>(resolve),
                                             std::forward<RejectType>(reject));
    }};
}